

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
PDA::Transducer::Generator::Generator(Generator *this,Tokenizer *tokenizer,StoreFst *storeFst)

{
  bool bVar1;
  wostream *pwVar2;
  vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_> *this_00;
  const_reference pvVar3;
  code *__sysno;
  wchar_t in_R8D;
  allocator<wchar_t> local_331;
  wstring local_330;
  wstring local_310;
  Generator local_2f0;
  Register local_2d0;
  wstring local_2c0;
  Register local_2a0;
  wstring local_290;
  wstring local_270;
  wstring local_250;
  wostream local_220 [8];
  wofstream ostream;
  StoreFst *storeFst_local;
  Tokenizer *tokenizer_local;
  Generator *this_local;
  
  this->m_mainFunctionExists = -1;
  this->m_tokenizer = tokenizer;
  this->m_storeFst = storeFst;
  std::wofstream::wofstream(local_220,"result.s",_S_out);
  pwVar2 = std::operator<<(local_220,(wstring *)Constants::firstLineComment_abi_cxx11_);
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(local_220,(wstring *)Constants::sectionDataString_abi_cxx11_);
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(local_220,(wstring *)Constants::integerOutputStringLabel_abi_cxx11_);
  pwVar2 = std::operator<<(pwVar2,L':');
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(local_220,(wstring *)Constants::integerOutputString_abi_cxx11_);
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(local_220,(wstring *)Constants::integerInputStringLabel_abi_cxx11_);
  pwVar2 = std::operator<<(pwVar2,L':');
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(local_220,(wstring *)Constants::integerInputString_abi_cxx11_);
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(local_220,(wstring *)Constants::sectionUninitializedDataString_abi_cxx11_
                          );
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(local_220,(wstring *)Constants::sectionTextString_abi_cxx11_);
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  bVar1 = isMainFunctionExists(this);
  if (bVar1) {
    pwVar2 = std::operator<<(local_220,(wstring *)Constants::globlStartLabel_abi_cxx11_);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    pwVar2 = std::operator<<(local_220,(wstring *)Constants::startLabel_abi_cxx11_);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    this_00 = Tokenizer::identifiers(this->m_tokenizer);
    pvVar3 = std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
             ::operator[](this_00,(long)this->m_mainFunctionExists);
    hash(&local_270,&pvVar3->decoratedName);
    call(&local_250,&local_270);
    pwVar2 = std::operator<<(local_220,(wstring *)&local_250);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    std::__cxx11::wstring::~wstring((wstring *)&local_250);
    std::__cxx11::wstring::~wstring((wstring *)&local_270);
    Register::Register(&local_2a0,0x50,Full);
    mov_abi_cxx11_(&local_290,(Generator *)0x3c,(int)&local_2a0,(Register *)0x0,in_R8D);
    pwVar2 = std::operator<<(local_220,(wstring *)&local_290);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    std::__cxx11::wstring::~wstring((wstring *)&local_290);
    Register::Register(&local_2d0,0,Full);
    mov_abi_cxx11_(&local_2c0,(Generator *)0x0,(int)&local_2d0,(Register *)0x0,in_R8D);
    pwVar2 = std::operator<<(local_220,(wstring *)&local_2c0);
    __sysno = std::endl<wchar_t,std::char_traits<wchar_t>>;
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    std::__cxx11::wstring::~wstring((wstring *)&local_2c0);
    syscall_abi_cxx11_(&local_2f0,(long)__sysno);
    pwVar2 = std::operator<<(local_220,(wstring *)&local_2f0);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    std::__cxx11::wstring::~wstring((wstring *)&local_2f0);
  }
  else {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_330,L"Main function not found, then all functions are extern",
               &local_331);
    comment(&local_310,&local_330);
    pwVar2 = std::operator<<(local_220,(wstring *)&local_310);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    std::__cxx11::wstring::~wstring((wstring *)&local_310);
    std::__cxx11::wstring::~wstring((wstring *)&local_330);
    std::allocator<wchar_t>::~allocator(&local_331);
    writeGlobalFunctions(this,local_220);
  }
  writeFunctions(this,local_220);
  std::wofstream::~wofstream(local_220);
  return;
}

Assistant:

Generator::Generator(const Tokenizer &tokenizer, const StoreFst &storeFst) :
    m_mainFunctionExists(-1), m_tokenizer(tokenizer),
    m_storeFst(storeFst)
{
    std::wofstream ostream("result.s");
    ostream << Constants::firstLineComment << std::endl;
    ostream << Constants::sectionDataString << std::endl;
    ostream << Constants::integerOutputStringLabel << L':' << std::endl;
    ostream << Constants::integerOutputString << std::endl;
    ostream << Constants::integerInputStringLabel << L':' << std::endl;
    ostream << Constants::integerInputString << std::endl;
    //writeLiterals(ostream);
    ostream << Constants::sectionUninitializedDataString << std::endl;
    ostream << Constants::sectionTextString << std::endl;
    if (isMainFunctionExists())
    {
        ostream << Constants::globlStartLabel << std::endl;
        ostream << Constants::startLabel << std::endl;
        ostream << call(  hash(m_tokenizer.identifiers()[static_cast<size_t>(m_mainFunctionExists)].decoratedName) ) << std::endl;
        ostream << mov(60, Register(Register::ReturnType, Register::Size::Full)) << std::endl;
        ostream << mov(0, Register(0, Register::Size::Full)) << std::endl;
        ostream << syscall() << std::endl;
    }
    else
    {
        ostream << comment(L"Main function not found, then all functions are extern") << std::endl;
        writeGlobalFunctions(ostream);
    }
    writeFunctions(ostream);
}